

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_type.cpp
# Opt level: O3

string * __thiscall
duckdb::CatalogTypeToString_abi_cxx11_(string *__return_storage_ptr__,duckdb *this,CatalogType type)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  iVar2 = (int)this;
  if (iVar2 < 0x47) {
    switch(iVar2) {
    case 1:
      pcVar3 = "Table";
      pcVar1 = "";
      break;
    case 2:
      pcVar3 = "Schema";
      pcVar1 = "";
      break;
    case 3:
      pcVar3 = "View";
      pcVar1 = "";
      break;
    case 4:
      pcVar3 = "Index";
      pcVar1 = "";
      break;
    case 5:
      pcVar3 = "Prepared Statement";
      pcVar1 = "";
      break;
    case 6:
      pcVar3 = "Sequence";
      pcVar1 = "";
      break;
    case 7:
      pcVar3 = "Collation";
      pcVar1 = "";
      break;
    case 8:
      pcVar3 = "Type";
      pcVar1 = "";
      break;
    case 9:
      pcVar3 = "Database";
      pcVar1 = "";
      break;
    default:
      goto switchD_00271cd9_caseD_a;
    case 0x19:
      pcVar3 = "Table Function";
      pcVar1 = "";
      break;
    case 0x1a:
      pcVar3 = "Scalar Function";
      pcVar1 = "";
      break;
    case 0x1b:
      pcVar3 = "Aggregate Function";
      pcVar1 = "";
      break;
    case 0x1c:
      pcVar3 = "Pragma Function";
      pcVar1 = "";
      break;
    case 0x1d:
      pcVar3 = "Copy Function";
      pcVar1 = "";
      break;
    case 0x1e:
      pcVar3 = "Macro Function";
      pcVar1 = "";
      break;
    case 0x1f:
      pcVar3 = "Table Macro Function";
      pcVar1 = "";
    }
  }
  else {
    if (iVar2 == 0x47) {
      pcVar3 = "Secret";
      pcVar1 = "";
      goto LAB_00271e55;
    }
    if (iVar2 == 0x48) {
      pcVar3 = "Secret Type";
      pcVar1 = "";
      goto LAB_00271e55;
    }
    if (iVar2 == 0x49) {
      pcVar3 = "Secret Function";
      pcVar1 = "";
      goto LAB_00271e55;
    }
switchD_00271cd9_caseD_a:
    pcVar3 = "INVALID";
    pcVar1 = "";
  }
LAB_00271e55:
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string CatalogTypeToString(CatalogType type) {
	switch (type) {
	case CatalogType::COLLATION_ENTRY:
		return "Collation";
	case CatalogType::TYPE_ENTRY:
		return "Type";
	case CatalogType::TABLE_ENTRY:
		return "Table";
	case CatalogType::SCHEMA_ENTRY:
		return "Schema";
	case CatalogType::DATABASE_ENTRY:
		return "Database";
	case CatalogType::TABLE_FUNCTION_ENTRY:
		return "Table Function";
	case CatalogType::SCALAR_FUNCTION_ENTRY:
		return "Scalar Function";
	case CatalogType::AGGREGATE_FUNCTION_ENTRY:
		return "Aggregate Function";
	case CatalogType::COPY_FUNCTION_ENTRY:
		return "Copy Function";
	case CatalogType::PRAGMA_FUNCTION_ENTRY:
		return "Pragma Function";
	case CatalogType::MACRO_ENTRY:
		return "Macro Function";
	case CatalogType::TABLE_MACRO_ENTRY:
		return "Table Macro Function";
	case CatalogType::VIEW_ENTRY:
		return "View";
	case CatalogType::INDEX_ENTRY:
		return "Index";
	case CatalogType::PREPARED_STATEMENT:
		return "Prepared Statement";
	case CatalogType::SEQUENCE_ENTRY:
		return "Sequence";
	case CatalogType::SECRET_ENTRY:
		return "Secret";
	case CatalogType::SECRET_TYPE_ENTRY:
		return "Secret Type";
	case CatalogType::SECRET_FUNCTION_ENTRY:
		return "Secret Function";
	case CatalogType::INVALID:
	case CatalogType::DELETED_ENTRY:
	case CatalogType::RENAMED_ENTRY:
	case CatalogType::DEPENDENCY_ENTRY:
		break;
	}
	return "INVALID";
}